

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core-test.cc
# Opt level: O0

void __thiscall check_custom::operator()(check_custom *this,handle h)

{
  bool bVar1;
  back_insert_iterator<fmt::v5::internal::basic_buffer<char>_> this_00;
  char *expected_expression;
  AssertionResult gtest_ar;
  format_context ctx;
  basic_buffer<char> *base;
  test_buffer buffer;
  basic_buffer<char> *in_stack_fffffffffffffe88;
  test_buffer *in_stack_fffffffffffffe90;
  char (*in_stack_fffffffffffffe98) [5];
  char *actual_expression;
  int line;
  allocator *file;
  Type type;
  locale_ref in_stack_fffffffffffffec8;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  in_stack_fffffffffffffed0;
  basic_string_view<char> in_stack_fffffffffffffee0;
  back_insert_iterator<fmt::v5::internal::basic_buffer<char>_> in_stack_fffffffffffffef0;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_ffffffffffffff08;
  locale_ref in_stack_ffffffffffffff10;
  locale_ref this_01;
  basic_buffer<char> local_48;
  char local_28 [40];
  
  type = (Type)((ulong)&local_48 >> 0x20);
  operator()::test_buffer::test_buffer(in_stack_fffffffffffffe90);
  this_00 = std::back_inserter<fmt::v5::internal::basic_buffer<char>>(in_stack_fffffffffffffe88);
  fmt::v5::basic_string_view<char>::basic_string_view
            ((basic_string_view<char> *)in_stack_fffffffffffffe90,(char *)in_stack_fffffffffffffe88)
  ;
  fmt::v5::format_args::format_args<>((format_args *)0x1896a2);
  fmt::v5::internal::locale_ref::locale_ref((locale_ref *)&stack0xffffffffffffff10);
  this_01.locale_ = in_stack_ffffffffffffff10.locale_;
  fmt::v5::
  basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>::
  basic_format_context
            ((basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>
              *)this_00.container,in_stack_fffffffffffffef0,in_stack_fffffffffffffee0,
             in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
  fmt::v5::
  basic_format_arg<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  ::handle::format((handle *)in_stack_fffffffffffffe90,
                   (basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>
                    *)in_stack_ffffffffffffff10.locale_);
  actual_expression = local_28;
  expected_expression = (char *)fmt::v5::internal::basic_buffer<char>::size(&local_48);
  file = (allocator *)&stack0xfffffffffffffedf;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&stack0xfffffffffffffee0,actual_expression,(ulong)expected_expression,file);
  testing::internal::EqHelper<false>::Compare<char[5],std::__cxx11::string>
            (expected_expression,actual_expression,in_stack_fffffffffffffe98,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffe90);
  line = (int)((ulong)expected_expression >> 0x20);
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffee0);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffedf);
  bVar1 = testing::AssertionResult::operator_cast_to_bool
                    ((AssertionResult *)&stack0xffffffffffffff00);
  if (!bVar1) {
    testing::Message::Message((Message *)this_00.container);
    testing::AssertionResult::failure_message((AssertionResult *)0x189842);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)this_00.container,type,(char *)file,line,actual_expression);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)this_01.locale_,(Message *)in_stack_ffffffffffffff08.ptr_);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffe90);
    testing::Message::~Message((Message *)0x189890);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1898f2);
  fmt::v5::
  basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>::
  ~basic_format_context
            ((basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>
              *)0x1898ff);
  operator()::test_buffer::~test_buffer((test_buffer *)0x18990c);
  return;
}

Assistant:

test_result operator()(
      fmt::basic_format_arg<fmt::format_context>::handle h) const {
    struct test_buffer : fmt::internal::basic_buffer<char> {
      char data[10];
      test_buffer() : fmt::internal::basic_buffer<char>(data, 0, 10) {}
      void grow(std::size_t) {}
    } buffer;
    fmt::internal::basic_buffer<char> &base = buffer;
    fmt::format_context ctx(std::back_inserter(base), "", fmt::format_args());
    h.format(ctx);
    EXPECT_EQ("test", std::string(buffer.data, buffer.size()));
    return test_result();
  }